

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *
wallet::coinselector_tests::KnapsackGroupOutputs
          (CoinsResult *available_coins,CWallet *wallet,CoinEligibilityFilter *filter)

{
  initializer_list<wallet::SelectionFilter> __l;
  int iVar1;
  undefined8 *in_RDX;
  CWallet *in_RSI;
  iterator in_RDI;
  long in_FS_OFFSET;
  CoinSelectionParams coin_selection_params;
  FastRandomContext rand;
  CFeeRate *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 uVar2;
  int in_stack_fffffffffffffdfc;
  uint in_stack_fffffffffffffe04;
  CFeeRate in_stack_fffffffffffffe10;
  CFeeRate in_stack_fffffffffffffe18;
  CFeeRate in_stack_fffffffffffffe20;
  _Optional_payload_base<int> in_stack_fffffffffffffe28;
  undefined1 *puVar3;
  int in_stack_fffffffffffffe60;
  undefined1 local_179 [25];
  OutputGroupTypeMap *local_160;
  FastRandomContext *local_158;
  _Optional_payload_base<int> local_148 [12];
  undefined8 local_e8;
  undefined1 uStack_e0;
  undefined7 uStack_df;
  undefined1 uStack_d8;
  undefined8 uStack_d7;
  undefined1 local_c8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0));
  CFeeRate::CFeeRate<int>(in_stack_fffffffffffffde8,0);
  CFeeRate::CFeeRate<int>(in_stack_fffffffffffffde8,0);
  CFeeRate::CFeeRate<int>(in_stack_fffffffffffffde8,0);
  std::optional<int>::optional((optional<int> *)local_148);
  uVar2 = 0;
  CoinSelectionParams::CoinSelectionParams
            ((CoinSelectionParams *)local_148[0],
             (FastRandomContext *)((ulong)in_stack_fffffffffffffe04 << 0x20),
             in_stack_fffffffffffffdfc,0,(CAmount)local_160,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe60,
             SUB81((ulong)local_158 >> 0x38,0),(optional<int>)in_stack_fffffffffffffe28);
  if (KnapsackGroupOutputs(wallet::CoinsResult_const&,wallet::CWallet&,wallet::CoinEligibilityFilter_const&)
      ::static_groups == '\0') {
    iVar1 = __cxa_guard_acquire(&KnapsackGroupOutputs(wallet::CoinsResult_const&,wallet::CWallet&,wallet::CoinEligibilityFilter_const&)
                                 ::static_groups);
    if (iVar1 != 0) {
      OutputGroupTypeMap::OutputGroupTypeMap((OutputGroupTypeMap *)local_158);
      __cxa_atexit(OutputGroupTypeMap::~OutputGroupTypeMap,&KnapsackGroupOutputs::static_groups,
                   &__dso_handle);
      __cxa_guard_release(&KnapsackGroupOutputs(wallet::CoinsResult_const&,wallet::CWallet&,wallet::CoinEligibilityFilter_const&)
                           ::static_groups);
    }
  }
  local_e8 = *in_RDX;
  uStack_d7 = *(undefined8 *)((long)in_RDX + 0x11);
  uStack_d8 = (undefined1)((ulong)*(undefined8 *)((long)in_RDX + 9) >> 0x38);
  uStack_e0 = (undefined1)in_RDX[1];
  uStack_df = (undefined7)((ulong)in_RDX[1] >> 8);
  local_c8 = 1;
  puVar3 = local_179;
  std::allocator<wallet::SelectionFilter>::allocator
            ((allocator<wallet::SelectionFilter> *)local_158);
  __l._M_len = (size_type)puVar3;
  __l._M_array = in_RDI;
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
            ((vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)in_RSI,__l
             ,(allocator_type *)in_stack_fffffffffffffe20.nSatoshisPerK);
  GroupOutputs(in_RSI,(CoinsResult *)in_stack_fffffffffffffe20.nSatoshisPerK,
               (CoinSelectionParams *)in_stack_fffffffffffffe18.nSatoshisPerK,
               (vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)
               in_stack_fffffffffffffe10.nSatoshisPerK);
  std::
  map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::operator[]((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                *)in_stack_fffffffffffffe10.nSatoshisPerK,(key_type *)local_148[0]);
  OutputGroupTypeMap::operator=
            ((OutputGroupTypeMap *)CONCAT44(in_stack_fffffffffffffdfc,uVar2),local_160);
  std::
  map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::~map((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
          *)local_158);
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::~vector
            ((vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)
             CONCAT44(in_stack_fffffffffffffdfc,uVar2));
  std::allocator<wallet::SelectionFilter>::~allocator
            ((allocator<wallet::SelectionFilter> *)local_158);
  FastRandomContext::~FastRandomContext(local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return &KnapsackGroupOutputs::static_groups.all_groups.mixed_group;
  }
  __stack_chk_fail();
}

Assistant:

inline std::vector<OutputGroup>& KnapsackGroupOutputs(const CoinsResult& available_coins, CWallet& wallet, const CoinEligibilityFilter& filter)
{
    FastRandomContext rand{};
    CoinSelectionParams coin_selection_params{
        rand,
        /*change_output_size=*/ 0,
        /*change_spend_size=*/ 0,
        /*min_change_target=*/ CENT,
        /*effective_feerate=*/ CFeeRate(0),
        /*long_term_feerate=*/ CFeeRate(0),
        /*discard_feerate=*/ CFeeRate(0),
        /*tx_noinputs_size=*/ 0,
        /*avoid_partial=*/ false,
    };
    static OutputGroupTypeMap static_groups;
    static_groups = GroupOutputs(wallet, available_coins, coin_selection_params, {{filter}})[filter];
    return static_groups.all_groups.mixed_group;
}